

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

QRegion __thiscall QRegion::united(QRegion *this,QRect *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  QRect *in_RDX;
  int *piVar7;
  long in_FS_OFFSET;
  QRegionPrivate local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  piVar6 = *(int **)(*(long *)r + 8);
  if (piVar6 != (int *)0x0) {
    iVar1 = *piVar6;
    if ((long)iVar1 != 0) {
      iVar2 = (in_RDX->x1).m_i;
      iVar3 = (in_RDX->y1).m_i;
      iVar4 = (in_RDX->x2).m_i;
      iVar5 = (in_RDX->y2).m_i;
      if ((iVar3 <= iVar5 && iVar2 <= iVar4) &&
         ((((iVar2 < piVar6[0xc] || (piVar6[0xe] < iVar4)) || (iVar3 < piVar6[0xd])) ||
          (piVar6[0xf] < iVar5)))) {
        if (((iVar2 <= piVar6[8]) && (piVar6[10] <= iVar4)) &&
           ((iVar3 <= piVar6[9] && (piVar6[0xb] <= iVar5)))) goto LAB_0042a6c5;
        if ((((piVar6[8] != iVar2 || iVar1 != 1) || (piVar6[10] != iVar4)) || (piVar6[9] != iVar3))
           || (piVar6[0xb] != iVar5)) {
          piVar7 = *(int **)(piVar6 + 4) + (long)iVar1 * 4 + -4;
          if (iVar1 == 1) {
            piVar7 = piVar6 + 8;
          }
          if ((piVar7[3] < iVar3) ||
             ((piVar7[3] == iVar5 && piVar7[1] == iVar3 && (piVar7[2] < iVar2)))) {
            this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion(this,(QRegion *)r);
            detach(this);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
              QRegionPrivate::append(this->d->qt_rgn,in_RDX);
              return (QRegion)(QRegionData *)this;
            }
          }
          else {
            piVar7 = *(int **)(piVar6 + 4);
            if (iVar1 == 1) {
              piVar7 = piVar6 + 8;
            }
            if ((iVar5 < piVar7[1]) ||
               (((iVar3 == piVar7[1] && (iVar5 == piVar7[3])) && (iVar4 < *piVar7)))) {
              this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
              QRegion(this,(QRegion *)r);
              detach(this);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                QRegionPrivate::prepend(this->d->qt_rgn,in_RDX);
                return (QRegion)(QRegionData *)this;
              }
            }
            else {
              this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
              QRegion(this);
              detach(this);
              local_70.numRects = 1;
              local_70.innerArea =
                   (((in_RDX->y2).m_i - (in_RDX->y1).m_i) + 1) *
                   (((in_RDX->x2).m_i - (in_RDX->x1).m_i) + 1);
              local_70.rects.d.d = (Data *)0x0;
              local_70.rects.d.ptr = (QRect *)0x0;
              local_70.rects.d.size = 0;
              local_70.extents.x1.m_i = (in_RDX->x1).m_i;
              local_70.extents.y1.m_i = (in_RDX->y1).m_i;
              local_70.extents.x2.m_i = (in_RDX->x2).m_i;
              local_70.extents.y2.m_i = (in_RDX->y2).m_i;
              local_70.innerRect.x1.m_i = (in_RDX->x1).m_i;
              local_70.innerRect.y1.m_i = (in_RDX->y1).m_i;
              local_70.innerRect.x2.m_i = (in_RDX->x2).m_i;
              local_70.innerRect.y2.m_i = (in_RDX->y2).m_i;
              UnionRegion(*(QRegionPrivate **)(*(long *)r + 8),&local_70,this->d->qt_rgn);
              if (&(local_70.rects.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_70.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_70.rects.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_70.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_70.rects.d.d)->super_QArrayData,0x10,0x10);
                }
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                return (QRegion)(QRegionData *)this;
              }
            }
          }
          goto LAB_0042a811;
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QRegion(this,(QRegion *)r);
        return (QRegion)(QRegionData *)this;
      }
      goto LAB_0042a811;
    }
  }
LAB_0042a6c5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QRegion(this,in_RDX,Rectangle);
    return (QRegion)(QRegionData *)this;
  }
LAB_0042a811:
  __stack_chk_fail();
}

Assistant:

QRegion QRegion::united(const QRect &r) const
{
    if (isEmptyHelper(d->qt_rgn))
        return r;
    if (r.isEmpty())
        return *this;

    if (d->qt_rgn->contains(r)) {
        return *this;
    } else if (d->qt_rgn->within(r)) {
        return r;
    } else if (d->qt_rgn->numRects == 1 && d->qt_rgn->extents == r) {
        return *this;
    } else if (d->qt_rgn->canAppend(&r)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->append(&r);
        return result;
    } else if (d->qt_rgn->canPrepend(&r)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->prepend(&r);
        return result;
    } else {
        QRegion result;
        result.detach();
        QRegionPrivate rp(r);
        UnionRegion(d->qt_rgn, &rp, *result.d->qt_rgn);
        return result;
    }
}